

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbt2DShape.cpp
# Opt level: O1

void __thiscall
cbt2DsegmentShape::getAabb
          (cbt2DsegmentShape *this,cbtTransform *t,cbtVector3 *aabbMin,cbtVector3 *aabbMax)

{
  uint uVar1;
  uint uVar2;
  float fVar3;
  undefined1 auVar4 [16];
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  uVar1 = *(uint *)&(this->super_cbtConvexInternalShape).field_0x44;
  fVar6 = *(float *)&this->field_0x48;
  fVar8 = (t->m_basis).m_el[0].m_floats[1];
  auVar11 = ZEXT416((uint)(t->m_basis).m_el[0].m_floats[0]);
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * fVar8)),ZEXT416(uVar1),auVar11);
  uVar2 = *(uint *)&this->field_0x4c;
  auVar15 = ZEXT416((uint)(t->m_basis).m_el[0].m_floats[2]);
  auVar14 = vfmadd231ss_fma(auVar14,ZEXT416(uVar2),auVar15);
  fVar7 = (t->m_basis).m_el[1].m_floats[1];
  auVar9 = ZEXT416((uint)(t->m_basis).m_el[1].m_floats[0]);
  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * fVar6)),ZEXT416(uVar1),auVar9);
  auVar10 = ZEXT416((uint)(t->m_basis).m_el[1].m_floats[2]);
  auVar16 = vfmadd231ss_fma(auVar16,ZEXT416(uVar2),auVar10);
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (t->m_basis).m_el[2].m_floats[1])),ZEXT416(uVar1),
                           ZEXT416((uint)(t->m_basis).m_el[2].m_floats[0]));
  auVar4 = vfmadd231ss_fma(auVar4,ZEXT416(uVar2),ZEXT416((uint)(t->m_basis).m_el[2].m_floats[2]));
  fVar6 = (t->m_origin).m_floats[0];
  fVar5 = (t->m_origin).m_floats[1];
  fVar3 = (this->P2).m_floats[1];
  auVar13 = ZEXT416((uint)(this->P2).m_floats[0]);
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * fVar8)),auVar13,auVar11);
  auVar12 = ZEXT416((uint)(this->P2).m_floats[2]);
  auVar11 = vfmadd231ss_fma(auVar11,auVar12,auVar15);
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * fVar3)),auVar13,auVar9);
  auVar15 = vfmadd231ss_fma(auVar15,auVar12,auVar10);
  auVar10 = ZEXT416((uint)(auVar4._0_4_ + (t->m_origin).m_floats[2]));
  auVar12 = vfnmadd213ss_fma(SUB6416(ZEXT464(0x3f000000),0),ZEXT416((uint)this->zthickness),auVar10)
  ;
  auVar9 = ZEXT416((uint)(fVar6 + auVar11._0_4_));
  auVar14 = ZEXT416((uint)(auVar14._0_4_ + fVar6));
  auVar4 = vminss_avx(auVar9,auVar14);
  auVar13 = ZEXT416((uint)(fVar5 + auVar15._0_4_));
  auVar16 = ZEXT416((uint)(auVar16._0_4_ + fVar5));
  auVar11 = vminss_avx(auVar13,auVar16);
  auVar15 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3f000000),0),ZEXT416((uint)this->zthickness),auVar10);
  auVar14 = vmaxss_avx(auVar9,auVar14);
  auVar16 = vmaxss_avx(auVar13,auVar16);
  fVar5 = auVar16._0_4_;
  (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xc])();
  fVar6 = fVar5;
  (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xc])(this);
  fVar6 = auVar11._0_4_ - fVar6;
  fVar7 = fVar6;
  (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xc])(this);
  fVar8 = fVar7;
  (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xc])(this);
  aabbMin->m_floats[0] = auVar4._0_4_ - fVar5;
  aabbMin->m_floats[1] = fVar6;
  aabbMin->m_floats[2] = auVar12._0_4_;
  aabbMin->m_floats[3] = 0.0;
  aabbMax->m_floats[0] = fVar7 + auVar14._0_4_;
  aabbMax->m_floats[1] = fVar8 + auVar16._0_4_;
  aabbMax->m_floats[2] = auVar15._0_4_ + 0.0;
  aabbMax->m_floats[3] = 0.0;
  return;
}

Assistant:

void cbt2DsegmentShape::getAabb(const cbtTransform& t,cbtVector3& aabbMin,cbtVector3& aabbMax) const
{
    cbtVector3 P1w = t*P1;
    cbtVector3 P2w = t*P2;
    cbtVector3 vminabs (std::min(P1w.x(),P2w.x()), std::min(P1w.y(),P2w.y()),  P1w.z()-(zthickness*0.5f));
    cbtVector3 vmaxabs (std::max(P1w.x(),P2w.x()), std::max(P1w.y(),P2w.y()),  P1w.z()+(zthickness*0.5f));
    vminabs -= cbtVector3(getMargin(),getMargin(),0);
    vmaxabs += cbtVector3(getMargin(),getMargin(),0);
    aabbMin = vminabs;
    aabbMax = vmaxabs;
}